

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ParameterSymbolBase::checkDefaultExpression()::NameSyntax_const__
          (void *this,NameSyntax *syntax)

{
  char *pcVar1;
  char *pcVar2;
  Symbol *ctx;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *selector;
  char *pcVar3;
  long lVar4;
  LookupResult result;
  LookupResult local_268;
  
  pcVar1 = local_268.selectors.
           super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
           .firstElement;
  local_268.found = (Symbol *)0x0;
  local_268.systemSubroutine._0_5_ = 0;
  local_268.systemSubroutine._5_3_ = 0;
  local_268.upwardCount = 0;
  local_268.flags.m_bits = '\0';
  local_268.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  local_268.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  pcVar2 = local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
           firstElement;
  local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  local_268.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)pcVar1;
  local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)pcVar2;
  Lookup::name(syntax,*this,(bitmask<slang::ast::LookupFlags>)0x12,&local_268);
  LookupResult::reportDiags(&local_268,*this);
  ctx = local_268.found;
  if (local_268.found != (Symbol *)0x0) {
    Compilation::noteReference(*(Compilation **)**this,local_268.found,false);
  }
  if (local_268.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .len != 0) {
    lVar4 = local_268.selectors.
            super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
            .len * 0x30;
    pcVar3 = (char *)local_268.selectors.
                     super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                     .data_;
    do {
      if ((pcVar3 != (char *)0x0) && (pcVar3[0x28] == '\0')) {
        ctx = (Symbol *)this;
        slang::syntax::detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::ast::ParameterSymbolBase::checkDefaultExpression()const::Visitor>
                  (*(SyntaxNode **)pcVar3,(Visitor *)this);
      }
      pcVar3 = pcVar3 + 0x30;
      lVar4 = lVar4 + -0x30;
    } while (lVar4 != 0);
  }
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_268.diagnostics,(EVP_PKEY_CTX *)ctx);
  if (local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ !=
      (pointer)pcVar2) {
    operator_delete(local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>
                    .data_);
  }
  if (local_268.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .data_ != (pointer)pcVar1) {
    operator_delete(local_268.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .data_);
  }
  return;
}

Assistant:

void handle(const NameSyntax& syntax) {
            LookupResult result;
            Lookup::name(syntax, context, LookupFlags::ForceHierarchical, result);
            result.reportDiags(context);
            if (result.found)
                context.getCompilation().noteReference(*result.found);

            for (auto& selector : result.selectors) {
                if (auto elemSel = std::get_if<0>(&selector))
                    (*elemSel)->visit(*this);
            }
        }